

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int buildCharField(charField *cf,bstring b1)

{
  byte bVar1;
  int local_24;
  uint c;
  int i;
  bstring b1_local;
  charField *cf_local;
  
  if (((b1 == (bstring)0x0) || (b1->data == (uchar *)0x0)) || (b1->slen < 1)) {
    cf_local._4_4_ = -1;
  }
  else {
    memset(cf,0,0x40);
    for (local_24 = 0; local_24 < b1->slen; local_24 = local_24 + 1) {
      bVar1 = b1->data[local_24] >> 5;
      cf->content[bVar1] = 1L << (b1->data[local_24] & 0x1f) | cf->content[bVar1];
    }
    cf_local._4_4_ = 0;
  }
  return cf_local._4_4_;
}

Assistant:

static int buildCharField (struct charField * cf, const bstring b1) {
int i;
	if (b1 == NULL || b1->data == NULL || b1->slen <= 0) return BSTR_ERR;
	memset ((void *) cf->content, 0, sizeof (struct charField));
	for (i=0; i < b1->slen; i++) {
		unsigned int c = (unsigned int) b1->data[i];
		cf->content[c >> LONG_LOG_BITS_QTY] |= ((LONG_TYPE) 1) << (c & (LONG_BITS_QTY-1));
	}
	return 0;
}